

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.h
# Opt level: O1

void __thiscall
Js::PropertyDescriptor::PropertyDescriptor(PropertyDescriptor *this,PropertyDescriptor *other)

{
  void *pvVar1;
  
  pvVar1 = (other->Value).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->Value).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  pvVar1 = (other->Getter).ptr;
  Memory::Recycler::WBSetBit((char *)&this->Getter);
  (this->Getter).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Getter);
  pvVar1 = (other->Setter).ptr;
  Memory::Recycler::WBSetBit((char *)&this->Setter);
  (this->Setter).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Setter);
  pvVar1 = (other->originalVar).ptr;
  Memory::Recycler::WBSetBit((char *)&this->originalVar);
  (this->originalVar).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->originalVar);
  this->writableSpecified = other->writableSpecified;
  this->enumerableSpecified = other->enumerableSpecified;
  this->configurableSpecified = other->configurableSpecified;
  this->valueSpecified = other->valueSpecified;
  this->getterSpecified = other->getterSpecified;
  this->setterSpecified = other->setterSpecified;
  this->Writable = other->Writable;
  this->Enumerable = other->Enumerable;
  this->Configurable = other->Configurable;
  this->fromProxy = other->fromProxy;
  return;
}

Assistant:

PropertyDescriptor(const PropertyDescriptor& other)
            :Value(other.Value),
            Getter(other.Getter),
            Setter(other.Setter),
            originalVar(other.originalVar),
            writableSpecified(other.writableSpecified),
            enumerableSpecified(other.enumerableSpecified),
            configurableSpecified(other.configurableSpecified),
            valueSpecified(other.valueSpecified),
            getterSpecified(other.getterSpecified),
            setterSpecified(other.setterSpecified),
            Writable(other.Writable),
            Enumerable(other.Enumerable),
            Configurable(other.Configurable),
            fromProxy(other.fromProxy)
        {
        }